

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_pred.c
# Opt level: O0

void uavs3d_if_hor_ver_chroma
               (pel *src,int i_src,pel *dst,int i_dst,int width,int height,s8 *coeff_h,s8 *coeff_v,
               int max_val)

{
  byte bVar1;
  char cVar2;
  byte bVar3;
  char cVar4;
  byte bVar5;
  char cVar6;
  byte bVar7;
  char cVar8;
  sbyte sVar9;
  int iVar10;
  int iVar11;
  sbyte sVar12;
  int local_4378;
  pel local_4374;
  int local_4370;
  int local_436c;
  pel local_4368;
  int local_4364;
  s16 **local_4360;
  s16 *tmp;
  s16 tmp_res [8576];
  int shift2;
  int add2;
  int shift1;
  int add1;
  int valv;
  int valu;
  int sumv;
  int sumu;
  int col;
  int row;
  int height_local;
  int width_local;
  int i_dst_local;
  pel *dst_local;
  pel *ppStack_10;
  int i_src_local;
  pel *src_local;
  
  if (max_val == 0xff) {
    shift2 = 0;
    sVar9 = 0xc;
  }
  else {
    shift2 = 2;
    sVar9 = 10;
  }
  sVar12 = (sbyte)shift2;
  iVar10 = (1 << sVar12) >> 1;
  iVar11 = 1 << (sVar9 - 1U & 0x1f);
  ppStack_10 = src + -i_src;
  local_4360 = &tmp;
  if (shift2 == 0) {
    for (sumu = -1; sumu < height + 2; sumu = sumu + 1) {
      for (sumv = 0; sumv < width; sumv = sumv + 2) {
        *(ushort *)((long)local_4360 + (long)sumv * 2) =
             (ushort)ppStack_10[sumv + -2] * (short)*coeff_h +
             (ushort)ppStack_10[sumv] * (short)coeff_h[1] +
             (ushort)ppStack_10[sumv + 2] * (short)coeff_h[2] +
             (ushort)ppStack_10[sumv + 4] * (short)coeff_h[3];
        *(ushort *)((long)local_4360 + (long)(sumv + 1) * 2) =
             (ushort)ppStack_10[sumv + -1] * (short)*coeff_h +
             (ushort)ppStack_10[sumv + 1] * (short)coeff_h[1] +
             (ushort)ppStack_10[sumv + 3] * (short)coeff_h[2] +
             (ushort)ppStack_10[sumv + 5] * (short)coeff_h[3];
      }
      ppStack_10 = ppStack_10 + i_src;
      local_4360 = (s16 **)((long)local_4360 + (long)width * 2);
    }
  }
  else {
    for (sumu = -1; sumu < height + 2; sumu = sumu + 1) {
      for (sumv = 0; sumv < width; sumv = sumv + 2) {
        bVar1 = ppStack_10[sumv + -1];
        cVar2 = *coeff_h;
        bVar3 = ppStack_10[sumv + 1];
        cVar4 = coeff_h[1];
        bVar5 = ppStack_10[sumv + 3];
        cVar6 = coeff_h[2];
        bVar7 = ppStack_10[sumv + 5];
        cVar8 = coeff_h[3];
        *(short *)((long)local_4360 + (long)sumv * 2) =
             (short)((int)((uint)ppStack_10[sumv + -2] * (int)*coeff_h +
                           (uint)ppStack_10[sumv] * (int)coeff_h[1] +
                           (uint)ppStack_10[sumv + 2] * (int)coeff_h[2] +
                           (uint)ppStack_10[sumv + 4] * (int)coeff_h[3] + iVar10) >> sVar12);
        *(short *)((long)local_4360 + (long)(sumv + 1) * 2) =
             (short)((int)((uint)bVar1 * (int)cVar2 + (uint)bVar3 * (int)cVar4 +
                           (uint)bVar5 * (int)cVar6 + (uint)bVar7 * (int)cVar8 + iVar10) >> sVar12);
      }
      ppStack_10 = ppStack_10 + i_src;
      local_4360 = (s16 **)((long)local_4360 + (long)width * 2);
    }
  }
  local_4360 = (s16 **)(tmp_res + (long)width + -4);
  _width_local = dst;
  for (sumu = 0; sumu < height; sumu = sumu + 1) {
    for (sumv = 0; sumv < width; sumv = sumv + 2) {
      local_436c = (int)*(short *)((long)local_4360 + (long)(sumv - width) * 2) * (int)*coeff_v +
                   (int)*(short *)((long)local_4360 + (long)sumv * 2) * (int)coeff_v[1] +
                   (int)*(short *)((long)local_4360 + (long)(sumv + width) * 2) * (int)coeff_v[2] +
                   (int)*(short *)((long)local_4360 + (long)(sumv + width * 2) * 2) *
                   (int)coeff_v[3] + iVar11 >> sVar9;
      local_4378 = (int)*(short *)((long)local_4360 + (long)((sumv + 1) - width) * 2) *
                   (int)*coeff_v +
                   (int)*(short *)((long)local_4360 + (long)(sumv + 1) * 2) * (int)coeff_v[1] +
                   (int)*(short *)((long)local_4360 + (long)(sumv + 1 + width) * 2) *
                   (int)coeff_v[2] +
                   (int)*(short *)((long)local_4360 + (long)(sumv + 1 + width * 2) * 2) *
                   (int)coeff_v[3] + iVar11 >> sVar9;
      local_4364 = local_436c;
      if (max_val < local_436c) {
        local_4364 = max_val;
      }
      if (local_4364 < 0) {
        local_4368 = '\0';
      }
      else {
        if (max_val < local_436c) {
          local_436c = max_val;
        }
        local_4368 = (pel)local_436c;
      }
      _width_local[sumv] = local_4368;
      local_4370 = local_4378;
      if (max_val < local_4378) {
        local_4370 = max_val;
      }
      if (local_4370 < 0) {
        local_4374 = '\0';
      }
      else {
        if (max_val < local_4378) {
          local_4378 = max_val;
        }
        local_4374 = (pel)local_4378;
      }
      _width_local[sumv + 1] = local_4374;
    }
    _width_local = _width_local + i_dst;
    local_4360 = (s16 **)((long)local_4360 + (long)width * 2);
  }
  return;
}

Assistant:

static void uavs3d_if_hor_ver_chroma(const pel *src, int i_src, pel *dst, int i_dst, int width, int height, const s8 *coeff_h, const s8 *coeff_v, int max_val)
{
    int row, col;
    int sumu, sumv, valu, valv;
    int add1, shift1;
    int add2, shift2;

    ALIGNED_16(s16 tmp_res[(64 + 3) * 64 * 2]); // UV interlaced
    s16 *tmp;

    if (max_val == 255) { // 8 bit_depth
        shift1 = 0;
        shift2 = 12;
    }
    else { // 10 bit_depth
        shift1 = 2;
        shift2 = 10;
    }

    add1 = (1 << (shift1)) >> 1;
    add2 = 1 << (shift2 - 1);

    src += -1 * i_src;
    tmp = tmp_res;

    if (shift1) {
        for (row = -1; row < height + 2; row++) {
            for (col = 0; col < width; col += 2) {
                sumu = FLT_4TAP_HOR(src, col, coeff_h);
                sumv = FLT_4TAP_HOR(src, col + 1, coeff_h);
                tmp[col] = (sumu + add1) >> shift1;
                tmp[col + 1] = (sumv + add1) >> shift1;
            }
            src += i_src;
            tmp += width;
        }
    }
    else {
        for (row = -1; row < height + 2; row++) {
            for (col = 0; col < width; col += 2) {
                tmp[col] = FLT_4TAP_HOR(src, col, coeff_h);
                tmp[col + 1] = FLT_4TAP_HOR(src, col + 1, coeff_h);
            }
            src += i_src;
            tmp += width;
        }
    }

    tmp = tmp_res + 1 * width;

    for (row = 0; row < height; row++) {
        for (col = 0; col < width; col += 2) {
            sumu = FLT_4TAP_VER(tmp, col, width, coeff_v);
            sumv = FLT_4TAP_VER(tmp, col + 1, width, coeff_v);
            valu = (sumu + add2) >> shift2;
            valv = (sumv + add2) >> shift2;
            dst[col] = COM_CLIP3(0, max_val, valu);
            dst[col + 1] = COM_CLIP3(0, max_val, valv);
        }
        dst += i_dst;
        tmp += width;
    }
}